

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

bool __thiscall
duckdb::ART::ConstructInternal
          (ART *this,unsafe_vector<ARTKey> *keys,unsafe_vector<ARTKey> *row_ids,Node *node,
          ARTKeySection *section)

{
  ARTKey *key;
  idx_t iVar1;
  idx_t iVar2;
  pointer pAVar3;
  idx_t depth;
  idx_t iVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  pointer pAVar7;
  reference<Node> node_00;
  int iVar8;
  ulong uVar9;
  NType type;
  ulong uVar10;
  idx_t iVar11;
  ARTKeySection *child;
  pointer section_00;
  long lVar12;
  bool bVar13;
  bool bVar14;
  unsafe_vector<ARTKeySection> children;
  Node new_child;
  reference<Node> ref;
  unsafe_vector<ARTKeySection> local_68;
  IndexPointer local_48;
  pointer local_40;
  reference<Node> local_38;
  
  iVar1 = section->start;
  iVar2 = section->end;
  pAVar3 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
           super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
           super__Vector_impl_data._M_start;
  key = pAVar3 + iVar1;
  depth = section->depth;
  iVar4 = pAVar3[iVar1].len;
  bVar14 = iVar4 == depth;
  if (!bVar14) {
    pdVar5 = key->data;
    pdVar6 = pAVar3[iVar2].data;
    iVar11 = depth;
    if (pdVar5[depth] == pdVar6[depth]) {
      do {
        iVar11 = iVar11 + 1;
        section->depth = iVar11;
        bVar14 = iVar4 == iVar11;
        if (bVar14) goto LAB_00c28a5f;
      } while (pdVar5[iVar11] == pdVar6[iVar11]);
    }
    if (!bVar14) {
      local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
      super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>._M_impl.
      super__Vector_impl_data._M_start = (ARTKeySection *)0x0;
      local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
      super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>._M_impl.
      super__Vector_impl_data._M_finish = (ARTKeySection *)0x0;
      local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
      super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ARTKeySection::GetChildSections(section,&local_68,keys);
      local_38._M_data = node;
      Prefix::New(this,&local_38,key,depth,section->depth - depth);
      node_00._M_data = local_38._M_data;
      uVar9 = (long)local_68.
                    super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
                    super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_68.
                    super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
                    super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      type = NODE_4;
      if ((4 < uVar9) && (type = NODE_16, 0x10 < uVar9)) {
        type = NODE_256 - (uVar9 < 0x31);
      }
      Node::New(this,local_38._M_data,type);
      pAVar7 = local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
               super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (section_00 = local_68.
                        super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
                        super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>
                        ._M_impl.super__Vector_impl_data._M_start; bVar14 = section_00 != pAVar7,
          bVar14; section_00 = section_00 + 1) {
        local_48.data = 0;
        bVar13 = ConstructInternal(this,keys,row_ids,(Node *)&local_48,section_00);
        Node::InsertChild(this,node_00._M_data,section_00->key_byte,(Node)local_48.data);
        if (!bVar13) break;
      }
      if (local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
          super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>._M_impl.
          super__Vector_impl_data._M_start != (ARTKeySection *)0x0) {
        operator_delete(local_68.
                        super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
                        super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00c28be9;
    }
  }
LAB_00c28a5f:
  local_40 = (pointer)node;
  iVar8 = (*(this->super_BoundIndex).super_Index._vptr_Index[5])(this);
  bVar13 = (byte)((char)iVar8 - 1U) < 2;
  lVar12 = iVar2 - iVar1;
  bVar14 = lVar12 != 0 && bVar13;
  if (lVar12 == 0 || !bVar13) {
    local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
    super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>._M_impl.
    super__Vector_impl_data._M_start = local_40;
    Prefix::New(this,(reference<Node> *)&local_68,key,depth,
                (ulong)((int)key->len - (int)depth & 0xff));
    if (iVar2 == iVar1) {
      uVar9 = *(ulong *)(row_ids->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                        super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
                        super__Vector_impl_data._M_start[section->start].data;
      uVar10 = uVar9 & 0xfffffffffffffff8 ^ 0x87;
      ((IndexPointer *)
      &(local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
        super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>._M_impl.
        super__Vector_impl_data._M_start)->start)->data =
           uVar9 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 | (uVar10 & 0xff0000000000) >> 0x18 |
           (uVar10 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
           (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
    }
    else {
      Leaf::New(this,(reference<Node> *)&local_68,row_ids,section->start,lVar12 + 1);
    }
    bVar14 = false;
  }
LAB_00c28be9:
  return (bool)~bVar14;
}

Assistant:

bool ART::ConstructInternal(const unsafe_vector<ARTKey> &keys, const unsafe_vector<ARTKey> &row_ids, Node &node,
                            ARTKeySection &section) {
	D_ASSERT(section.start < keys.size());
	D_ASSERT(section.end < keys.size());
	D_ASSERT(section.start <= section.end);

	auto &start = keys[section.start];
	auto &end = keys[section.end];
	D_ASSERT(start.len != 0);

	// Increment the depth until we reach a leaf or find a mismatching byte.
	auto prefix_depth = section.depth;
	while (start.len != section.depth && start.ByteMatches(end, section.depth)) {
		section.depth++;
	}

	if (start.len == section.depth) {
		// We reached a leaf. All the bytes of start_key and end_key match.
		auto row_id_count = section.end - section.start + 1;
		if (IsUnique() && row_id_count != 1) {
			return false;
		}

		reference<Node> ref(node);
		auto count = UnsafeNumericCast<uint8_t>(start.len - prefix_depth);
		Prefix::New(*this, ref, start, prefix_depth, count);
		if (row_id_count == 1) {
			Leaf::New(ref, row_ids[section.start].GetRowId());
		} else {
			Leaf::New(*this, ref, row_ids, section.start, row_id_count);
		}
		return true;
	}

	// Create a new node and recurse.
	unsafe_vector<ARTKeySection> children;
	section.GetChildSections(children, keys);

	// Create the prefix.
	reference<Node> ref(node);
	auto prefix_length = section.depth - prefix_depth;
	Prefix::New(*this, ref, start, prefix_depth, prefix_length);

	// Create the node.
	Node::New(*this, ref, Node::GetNodeType(children.size()));
	for (auto &child : children) {
		Node new_child;
		auto success = ConstructInternal(keys, row_ids, new_child, child);
		Node::InsertChild(*this, ref, child.key_byte, new_child);
		if (!success) {
			return false;
		}
	}
	return true;
}